

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assembler.cpp
# Opt level: O2

bool runArmips(ArmipsArguments *settings)

{
  pointer pEVar1;
  pointer pLVar2;
  bool bVar3;
  int iVar4;
  ExpressionFunctionHandler *pEVar5;
  byte bVar6;
  pointer *__ptr;
  size_t i;
  ulong uVar7;
  size_t i_1;
  long lVar8;
  LabelDefinition *label;
  pointer name;
  _Head_base<0UL,_CAssemblerCommand_*,_false> local_7d8;
  undefined1 local_7d0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  errors;
  long local_7b0;
  long local_7a8;
  _Base_ptr local_7a0;
  _Base_ptr local_798;
  long local_790;
  long local_788;
  long local_780;
  long local_778;
  long local_770;
  long local_768;
  long local_760;
  long local_758;
  size_t local_750;
  int64_t startSharedFreePosition;
  int64_t startFreePosition;
  SymbolData symData;
  Token token;
  Parser parser;
  TextFile input;
  TempData tempData;
  
  Global.Section = 0;
  Global.nocash = false;
  Global.relativeInclude = false;
  Global.FileInfo.TotalLineCount = 0;
  Global.multiThreading = true;
  Architecture::setCurrent(&InvalidArchitecture.super_Architecture);
  Tokenizer::clearEquValues();
  Logger::clear();
  Allocations::clear();
  EncodingTable::clear(&Global.Table);
  SymbolTable::clear(&Global.symbolTable);
  FileList::clear(&Global.fileList);
  Global.FileInfo.TotalLineCount = 0;
  Global.FileInfo.FileNum = 0;
  Global.FileInfo.LineNumber = 0;
  CArmArchitecture::clear(&Arm);
  pEVar5 = ExpressionFunctionHandler::instance();
  ExpressionFunctionHandler::reset(pEVar5);
  pEVar5 = ExpressionFunctionHandler::instance();
  registerExpressionFunctions(pEVar5);
  Parser::Parser(&parser);
  SymbolData::SymbolData(&symData);
  TextFile::TextFile(&tempData.file);
  Logger::silent = settings->silent;
  Logger::errorOnWarning = settings->errorOnWarning;
  bVar3 = ghc::filesystem::path::empty(&settings->symFileName);
  if (!bVar3) {
    iVar4 = settings->symFileVersion;
    ghc::filesystem::path::operator=(&symData.nocashSymFileName,&settings->symFileName);
    symData.nocashSymVersion = iVar4;
  }
  bVar3 = ghc::filesystem::path::empty(&settings->tempFileName);
  if (!bVar3) {
    ghc::filesystem::path::operator=(&tempData.file.fileName,&settings->tempFileName);
  }
  token.originalText._M_dataplus._M_p = (pointer)&token.originalText.field_2;
  token.value.super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
  super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
  super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
  super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
  super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
  super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>._M_index =
       '\0';
  token.line = 0;
  token.column._0_5_ = 0;
  token.column._5_3_ = 0;
  token.type = Invalid;
  token.checked = false;
  token.originalText._M_string_length = 0;
  token.originalText.field_2._M_local_buf[0] = '\0';
  lVar8 = 0x20;
  for (uVar7 = 0;
      pEVar1 = (settings->equList).
               super__Vector_base<EquationDefinition,_std::allocator<EquationDefinition>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar7 < (ulong)((long)(settings->equList).
                            super__Vector_base<EquationDefinition,_std::allocator<EquationDefinition>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar1 >> 6);
      uVar7 = uVar7 + 1) {
    Parser::addEquation(&parser,&token,(Identifier *)((long)pEVar1 + lVar8 + -0x20),
                        (string *)((long)&(pEVar1->name)._name._M_dataplus._M_p + lVar8));
    lVar8 = lVar8 + 0x40;
  }
  SymbolTable::addLabels(&Global.symbolTable,&settings->labels);
  pLVar2 = (settings->labels).super__Vector_base<LabelDefinition,_std::allocator<LabelDefinition>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (name = (settings->labels).
              super__Vector_base<LabelDefinition,_std::allocator<LabelDefinition>_>._M_impl.
              super__Vector_impl_data._M_start; name != pLVar2; name = name + 1) {
    SymbolData::addLabel(&symData,name->value,(string *)name);
  }
  if (Logger::error != false) {
    bVar3 = false;
    goto LAB_00126b0c;
  }
  TextFile::TextFile(&input);
  if (settings->mode == FILE) {
    Global.memoryMode = false;
    iVar4 = TextFile::open(&input,(char *)&settings->inputFileName,0,5);
    if ((char)iVar4 != '\0') goto LAB_001268f4;
    Logger::printError<>(Error,"Could not open file");
    bVar3 = false;
  }
  else {
    if (settings->mode == MEMORY) {
      Global.memoryMode = true;
      std::__shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&Global.memoryFile.super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>,
                 &(settings->memoryFile).
                  super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>);
      TextFile::openMemory(&input,&settings->content);
    }
LAB_001268f4:
    Parser::parseFile((Parser *)local_7d0,(TextFile *)&parser,SUB81(&input,0));
    Logger::printQueue();
    if (Logger::error == false) {
      if (local_7d0 == (undefined1  [8])0x0) {
        bVar3 = true;
      }
      else {
        local_7d8._M_head_impl = (CAssemblerCommand *)local_7d0;
        local_7d0 = (undefined1  [8])0x0;
        bVar3 = encodeAssembly((unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>
                                *)&local_7d8,&symData,&tempData);
        if (local_7d8._M_head_impl != (CAssemblerCommand *)0x0) {
          (*(local_7d8._M_head_impl)->_vptr_CAssemblerCommand[1])();
        }
        local_7d8._M_head_impl = (CAssemblerCommand *)0x0;
      }
    }
    else {
      bVar3 = false;
    }
    if ((g_fileManager->activeFile).super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)0x0) {
      if (Global.memoryMode == false) {
        Logger::printError<>(Warning,"File not closed");
      }
      FileManager::closeFile(g_fileManager);
    }
    if (settings->errorsResult !=
        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x0) {
      Logger::getErrors_abi_cxx11_();
      lVar8 = 0;
      for (uVar7 = 0;
          uVar7 < (ulong)((long)errors.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)errors.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 5); uVar7 = uVar7 + 1)
      {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(settings->errorsResult,
                    (value_type *)
                    ((long)&((errors.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar8)
                   );
        lVar8 = lVar8 + 0x20;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&errors);
    }
    if (settings->showStats == true) {
      Allocations::collectStats();
      Logger::printLine<long,long>("Total areas and regions: %lld / %lld",&local_778,&local_780);
      Logger::printLine<long,long>("Total regions: %lld / %lld",&local_768,&local_770);
      Logger::printLine<long,long,long>
                ("Largest area or region: 0x%08llX, %lld / %lld",(long *)&errors,
                 (long *)&errors.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (long *)&errors.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
      startFreePosition = (long)&local_7a0->_M_color + local_7b0;
      Logger::printLine<long,long,long,long>
                ("Most free area or region: 0x%08llX, %lld / %lld (free at 0x%08llX)",&local_7b0,
                 (long *)&local_7a0,&local_7a8,&startFreePosition);
      startSharedFreePosition = (long)&local_798->_M_color + local_788;
      Logger::printLine<long,long,long,long>
                ("Most free region: 0x%08llX, %lld / %lld (free at 0x%08llX)",(long *)&local_798,
                 &local_788,&local_790,&startSharedFreePosition);
      if (local_750 != 0) {
        Logger::printLine<long>("Total pool size: %lld",(long *)&local_750);
        Logger::printLine<long,long>("Largest pool: 0x%08llX, %lld",&local_760,&local_758);
      }
    }
    bVar6 = Logger::error ^ 1;
    if (local_7d0 != (undefined1  [8])0x0) {
      (*(*(_func_int ***)local_7d0)[1])();
    }
    bVar3 = (bool)(bVar3 & bVar6);
  }
  TextFile::~TextFile(&input);
LAB_00126b0c:
  Token::~Token(&token);
  TextFile::~TextFile(&tempData.file);
  SymbolData::~SymbolData(&symData);
  Parser::~Parser(&parser);
  return bVar3;
}

Assistant:

bool runArmips(ArmipsArguments& settings)
{
	// initialize and reset global data
	Global.Section = 0;
	Global.nocash = false;
	Global.FileInfo.TotalLineCount = 0;
	Global.relativeInclude = false;
	Global.multiThreading = true;
	Architecture::setCurrent(InvalidArchitecture);

	Tokenizer::clearEquValues();
	Logger::clear();
	Allocations::clear();
	Global.Table.clear();
	Global.symbolTable.clear();

	Global.fileList.clear();
	Global.FileInfo.TotalLineCount = 0;
	Global.FileInfo.LineNumber = 0;
	Global.FileInfo.FileNum = 0;

	Arm.clear();

	ExpressionFunctionHandler::instance().reset();
	registerExpressionFunctions(ExpressionFunctionHandler::instance());

	// process settings
	Parser parser;
	SymbolData symData;
	TempData tempData;
	
	Logger::setSilent(settings.silent);
	Logger::setErrorOnWarning(settings.errorOnWarning);

	if (!settings.symFileName.empty())
		symData.setNocashSymFileName(settings.symFileName, settings.symFileVersion);

	if (!settings.tempFileName.empty())
		tempData.setFileName(settings.tempFileName);

	Token token;
	for (size_t i = 0; i < settings.equList.size(); i++)
	{
		parser.addEquation(token, settings.equList[i].name, settings.equList[i].value);
	}

	Global.symbolTable.addLabels(settings.labels);
	for (const LabelDefinition& label : settings.labels)
	{
		symData.addLabel(label.value, label.name.string());
	}

	if (Logger::hasError())
		return false;

	// run assembler
	TextFile input;
	switch (settings.mode)
	{
	case ArmipsMode::FILE:
		Global.memoryMode = false;		
		if (!input.open(settings.inputFileName,TextFile::Read))
		{
			Logger::printError(Logger::Error, "Could not open file");
			return false;
		}
		break;
	case ArmipsMode::MEMORY:
		Global.memoryMode = true;
		Global.memoryFile = settings.memoryFile;
		input.openMemory(settings.content);
		break;
	}

	std::unique_ptr<CAssemblerCommand> content = parser.parseFile(input);
	Logger::printQueue();

	bool result = !Logger::hasError();
	if (result && content != nullptr)
		result = encodeAssembly(std::move(content), symData, tempData);
	
	if (g_fileManager->hasOpenFile())
	{
		if (!Global.memoryMode)
			Logger::printError(Logger::Warning, "File not closed");
		g_fileManager->closeFile();
	}

	// return errors
	if (settings.errorsResult != nullptr)
	{
		std::vector<std::string> errors = Logger::getErrors();
		for (size_t i = 0; i < errors.size(); i++)
			settings.errorsResult->push_back(errors[i]);
	}

	if (settings.showStats)
		printStats(Allocations::collectStats());

	if (Logger::hasError())
	{
		return false;
	}

	return result;
}